

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall
Catch::Runner::sectionStarted
          (Runner *this,string *name,string *description,SourceLineInfo *lineInfo,Counts *assertions
          )

{
  RunningTest *this_00;
  IReporter *pIVar1;
  size_t sVar2;
  bool bVar3;
  ostream *poVar4;
  ostringstream oss;
  string sStack_1c8;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar4 = std::operator<<((ostream *)local_1a8,(string *)name);
  poVar4 = std::operator<<(poVar4,"@");
  operator<<(poVar4,lineInfo);
  this_00 = this->m_runningTest;
  std::__cxx11::stringbuf::str();
  bVar3 = RunningTest::addSection(this_00,&sStack_1c8);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  if (bVar3) {
    SourceLineInfo::operator=(&(this->m_lastAssertionInfo).lineInfo,lineInfo);
    pIVar1 = (this->m_reporter).m_p;
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[0xb])(pIVar1,name,description);
    sVar2 = (this->m_totals).assertions.failed;
    assertions->passed = (this->m_totals).assertions.passed;
    assertions->failed = sVar2;
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return bVar3;
}

Assistant:

virtual bool sectionStarted (
            const std::string& name,
            const std::string& description,
            const SourceLineInfo& lineInfo,
            Counts& assertions
        )
        {
            std::ostringstream oss;
            oss << name << "@" << lineInfo;

            if( !m_runningTest->addSection( oss.str() ) )
                return false;

            m_lastAssertionInfo.lineInfo = lineInfo;

            m_reporter->StartSection( name, description );
            assertions = m_totals.assertions;

            return true;
        }